

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexPattern.cpp
# Opt level: O1

GroupInfo __thiscall UnifiedRegex::RegexPattern::GetGroup(RegexPattern *this,int groupId)

{
  Matcher *pMVar1;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  
  if ((groupId != 0) &&
     ((pMVar1 = (this->rep).unified.matcher.ptr, pMVar1 == (Matcher *)0x0 ||
      (((pMVar1->groupInfos).ptr)->length == 0xffffffff)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexPattern.cpp"
                       ,0x80,"(groupId == 0 || WasLastMatchSuccessful())",
                       "groupId == 0 || WasLastMatchSuccessful()");
    if (!bVar4) goto LAB_00ef29c7;
    *puVar5 = 0;
  }
  if ((groupId < 0) || ((int)(uint)((this->rep).unified.program.ptr)->numGroups <= groupId)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexPattern.cpp"
                       ,0x81,"(groupId >= 0 && groupId < NumGroups())",
                       "groupId >= 0 && groupId < NumGroups()");
    if (!bVar4) goto LAB_00ef29c7;
    *puVar5 = 0;
  }
  lVar2 = *(long *)((long)&this->rep + 8);
  if ((groupId < 0) || ((int)(uint)*(ushort *)(*(long *)(lVar2 + 0x10) + 0xc) <= groupId)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                       "groupId >= 0 && groupId < program->numGroups");
    if (!bVar4) {
LAB_00ef29c7:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  return *(GroupInfo *)(*(long *)(lVar2 + 0x18) + (long)groupId * 8);
}

Assistant:

GroupInfo RegexPattern::GetGroup(int groupId) const
    {
        Assert(groupId == 0 || WasLastMatchSuccessful());
        Assert(groupId >= 0 && groupId < NumGroups());
        return rep.unified.matcher->GetGroup(groupId);
    }